

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall vera::Mesh::invertWindingOrder(Mesh *this)

{
  value_type vVar1;
  value_type vVar2;
  DrawMode DVar3;
  size_type sVar4;
  reference pvVar5;
  ulong local_20;
  size_t i;
  int tmp;
  Mesh *this_local;
  
  DVar3 = getDrawMode(this);
  if (DVar3 == TRIANGLES) {
    for (local_20 = 0;
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_indices),
        local_20 < sVar4; local_20 = local_20 + 3) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_indices,local_20 + 1);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_indices,local_20 + 2);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_indices,local_20 + 1);
      *pvVar5 = vVar2;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_indices,local_20 + 2);
      *pvVar5 = vVar1;
    }
  }
  return;
}

Assistant:

void Mesh::invertWindingOrder() {
    if ( getDrawMode() == TRIANGLES) {
        int tmp;
        for (size_t i = 0; i < m_indices.size(); i += 3) {
            tmp = m_indices[i+1];
            m_indices[i+1] = m_indices[i+2];
            m_indices[i+2] = tmp;
        }
    }
}